

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

String * __thiscall
Rml::Element::GetAddress_abi_cxx11_
          (String *__return_storage_ptr__,Element *this,bool include_pseudo_classes,
          bool include_parents)

{
  pointer pcVar1;
  pointer ppVar2;
  long lVar3;
  PseudoClassMap *pPVar4;
  long *plVar5;
  undefined7 in_register_00000009;
  size_type *psVar6;
  undefined7 in_register_00000011;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>
  *pseudo_class;
  pointer ppVar7;
  String address;
  String classes;
  _Alloc_hider local_b8;
  size_type local_b0;
  char local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 local_94;
  String local_90;
  String local_70;
  String local_50;
  
  local_94 = (undefined4)CONCAT71(in_register_00000009,include_parents);
  local_98 = (undefined4)CONCAT71(in_register_00000011,include_pseudo_classes);
  local_b8._M_p = &local_a8;
  pcVar1 = (this->tag)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + (this->tag)._M_string_length);
  if ((this->id)._M_string_length != 0) {
    ::std::__cxx11::string::append((char *)&local_b8);
    ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)(this->id)._M_dataplus._M_p);
  }
  ElementStyle::GetClassNames_abi_cxx11_(&local_70,&this->meta->style);
  if (local_70._M_string_length != 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    StringUtilities::Replace(&local_90,&local_50,' ','.');
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::string::append((char *)&local_b8);
    ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_70._M_dataplus._M_p);
  }
  if ((char)local_98 != '\0') {
    pPVar4 = ElementStyle::GetActivePseudoClasses_abi_cxx11_(&this->meta->style);
    ppVar2 = (pPVar4->m_container).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar7 = (pPVar4->m_container).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2; ppVar7 = ppVar7 + 1)
    {
      ::std::__cxx11::string::append((char *)&local_b8);
      ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)(ppVar7->first)._M_dataplus._M_p);
    }
  }
  if (((char)local_94 == '\0') || (this->parent == (Element *)0x0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_b8._M_p == &local_a8) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_a7,local_a8);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_a0;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_a7,local_a8);
    }
    __return_storage_ptr__->_M_string_length = local_b0;
    local_b0 = 0;
    local_a8 = '\0';
    local_b8._M_p = &local_a8;
  }
  else {
    ::std::__cxx11::string::append((char *)&local_b8);
    GetAddress_abi_cxx11_(&local_90,this->parent,(bool)(char)local_98,true);
    plVar5 = (long *)::std::__cxx11::string::replace
                               ((ulong)&local_90,0,(char *)0x0,(ulong)local_b8._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,CONCAT71(uStack_a7,local_a8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String Element::GetAddress(bool include_pseudo_classes, bool include_parents) const
{
	// Add the tag name onto the address.
	String address(tag);

	// Add the ID if we have one.
	if (!id.empty())
	{
		address += "#";
		address += id;
	}

	String classes = meta->style.GetClassNames();
	if (!classes.empty())
	{
		classes = StringUtilities::Replace(classes, ' ', '.');
		address += ".";
		address += classes;
	}

	if (include_pseudo_classes)
	{
		const PseudoClassMap& pseudo_classes = meta->style.GetActivePseudoClasses();
		for (auto& pseudo_class : pseudo_classes)
		{
			address += ":";
			address += pseudo_class.first;
		}
	}

	if (include_parents && parent)
	{
		address += " < ";
		return address + parent->GetAddress(include_pseudo_classes, true);
	}
	else
		return address;
}